

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O1

string * __thiscall
Diligent::Parsing::GetContext<char_const*>
          (string *__return_storage_ptr__,Parsing *this,char **Start,char **End,char *Pos,
          size_t NumLines)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  char *Pos_1;
  char *pcVar8;
  string msg;
  stringstream Ctx;
  string local_1e8;
  string *local_1c8;
  char **local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  pcVar3 = *(char **)this;
  pcVar2 = *Start;
  local_1c0 = Start;
  if (pcVar3 == pcVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    lVar7 = 0;
    do {
      lVar5 = lVar7;
      pcVar4 = (char *)((long)End + lVar5);
      if ((pcVar4 <= pcVar3) || (cVar1 = *(char *)((long)End + lVar5 + -1), cVar1 == '\r')) break;
      lVar7 = lVar5 + -1;
    } while (cVar1 != '\n');
    pcVar8 = (char *)End;
    if ((char **)pcVar2 != End) {
      pcVar3 = (char *)0x2401;
      do {
        if ((*(byte *)End < 0xe) &&
           (pcVar8 = (char *)End, (0x2401U >> (*(byte *)End & 0x1f) & 1) != 0)) break;
        End = (char **)((long)End + 1);
        pcVar8 = pcVar2;
      } while (End != (char **)pcVar2);
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    pcVar3 = (char *)CONCAT71((int7)((ulong)pcVar3 >> 8),Pos != (char *)0x0);
    pcVar2 = *(char **)this;
    local_1c8 = __return_storage_ptr__;
    if (pcVar2 < pcVar4 && Pos != (char *)0x0) {
      pcVar6 = (char *)0x0;
      do {
        if (((*(char (*) [24])(pcVar4 + -1))[0] != 10) &&
           ((*(char (*) [24])(pcVar4 + -1))[0] != 0xd)) {
          FormatString<char[26],char[24]>
                    (&local_1e8,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x83c9c9,
                     (char (*) [24])pcVar3);
          DebugAssertionFailed
                    ((Char *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,
                                      local_1e8._M_dataplus._M_p._0_1_),"GetContext",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ParsingTools.hpp"
                     ,0x212);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_) !=
              &local_1e8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_1e8._M_dataplus._M_p._1_7_,
                                     local_1e8._M_dataplus._M_p._0_1_),
                            local_1e8.field_2._M_allocated_capacity + 1);
          }
        }
        pcVar2 = *(char **)this;
        if ((pcVar2 + 1 < pcVar4 && (*(char (*) [24])(pcVar4 + -1))[0] == 10) && (pcVar4[-2] == 0xd)
           ) {
          pcVar4 = pcVar4 + -1;
        }
        pcVar3 = pcVar4 + -(ulong)(pcVar2 < pcVar4);
        do {
          pcVar4 = pcVar3;
          pcVar3 = pcVar4;
          if ((pcVar4 <= pcVar2) || ((*(char (*) [24])(pcVar4 + -1))[0] == 0xd)) break;
          pcVar3 = pcVar4 + -1;
        } while ((*(char (*) [24])(pcVar4 + -1))[0] != 10);
        pcVar6 = pcVar6 + 1;
        pcVar2 = *(char **)this;
      } while ((pcVar6 < Pos) && (pcVar2 < pcVar4));
    }
    if ((pcVar4 != pcVar2) &&
       (((*(char (*) [24])(pcVar4 + -1))[0] != 10 && ((*(char (*) [24])(pcVar4 + -1))[0] != 0xd))))
    {
      FormatString<char[26],char[45]>
                (&local_1e8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"CtxStart == Start || IsNewLine(CtxStart[-1])",(char (*) [45])pcVar3
                );
      DebugAssertionFailed
                ((Char *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_)
                 ,"GetContext",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ParsingTools.hpp"
                 ,0x21b);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_) !=
          &local_1e8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_),
                        local_1e8.field_2._M_allocated_capacity + 1);
      }
    }
    std::ostream::write((char *)local_1a8,(long)pcVar4);
    cVar1 = (char)(ostream *)local_1a8;
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    if (lVar5 != 0) {
      lVar7 = -lVar5 + (ulong)(-lVar5 == 0);
      do {
        local_1e8._M_dataplus._M_p._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)&local_1e8,1);
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    local_1e8._M_dataplus._M_p._0_1_ = 0x5e;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1e8,1);
    __return_storage_ptr__ = local_1c8;
    pcVar3 = *local_1c0;
    if (pcVar8 != pcVar3) {
      if (Pos != (char *)0x0) {
        pcVar4 = (char *)0x0;
        pcVar2 = pcVar8;
        do {
          if (*pcVar2 == 0xd) {
            if ((pcVar2 + 1 != pcVar3) && (pcVar2[1] == 10)) {
              pcVar2 = pcVar2 + 1;
            }
          }
          else if (*pcVar2 == 0) break;
          pcVar6 = pcVar2 + (pcVar2 != pcVar3);
          pcVar2 = pcVar6;
          while ((pcVar6 != pcVar3 &&
                 ((0xd < (byte)*pcVar6 ||
                  (pcVar2 = pcVar6, (0x2401U >> ((byte)*pcVar6 & 0x1f) & 1) == 0))))) {
            pcVar6 = pcVar6 + 1;
            pcVar2 = pcVar3;
          }
          if ((pcVar2 == pcVar3) || (pcVar4 = pcVar4 + 1, Pos <= pcVar4)) break;
        } while( true );
      }
      std::ostream::write((char *)local_1a8,(long)pcVar8);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetContext(const IteratorType& Start, const IteratorType& End, IteratorType Pos, size_t NumLines) noexcept
{
    if (Start == End)
        return "";

    auto CtxStart = Pos;
    while (CtxStart > Start && !IsNewLine(CtxStart[-1]))
        --CtxStart;
    const size_t CharPos = Pos - CtxStart; // Position of the character in the line

    Pos = SkipLine(Pos, End);

    std::stringstream Ctx;
    {
        size_t LineAbove = 0;
        while (LineAbove < NumLines && CtxStart > Start)
        {
            VERIFY_EXPR(IsNewLine(CtxStart[-1]));
            if (CtxStart[-1] == '\n' && CtxStart > Start + 1 && CtxStart[-2] == '\r')
                --CtxStart;
            if (CtxStart > Start)
                --CtxStart;
            while (CtxStart > Start && !IsNewLine(CtxStart[-1]))
                --CtxStart;
            ++LineAbove;
        }
        VERIFY_EXPR(CtxStart == Start || IsNewLine(CtxStart[-1]));
        Ctx.write(&*CtxStart, Pos - CtxStart);
    }

    Ctx << std::endl;
    for (size_t i = 0; i < CharPos; ++i)
        Ctx << ' ';
    Ctx << '^';

    if (Pos != End)
    {
        auto   CtxEnd    = Pos;
        size_t LineBelow = 0;
        while (LineBelow < NumLines && CtxEnd != End && *CtxEnd != '\0')
        {
            if (*CtxEnd == '\r' && CtxEnd + 1 != End && CtxEnd[+1] == '\n')
                ++CtxEnd;
            if (CtxEnd != End)
                ++CtxEnd;
            CtxEnd = SkipLine(CtxEnd, End);
            ++LineBelow;
        }
        Ctx.write(&*Pos, CtxEnd - Pos);
    }

    return Ctx.str();
}